

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_cache.c
# Opt level: O1

int pt_bcache_lookup(pt_bcache_entry *bce,pt_block_cache *bcache,uint64_t index)

{
  int iVar1;
  
  iVar1 = -1;
  if ((bcache != (pt_block_cache *)0x0 && bce != (pt_bcache_entry *)0x0) &&
     (index < bcache->nentries)) {
    *bce = (pt_bcache_entry)bcache[(index & 0xffffffff) + 1].nentries;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int pt_bcache_lookup(struct pt_bcache_entry *bce,
		     struct pt_block_cache *bcache, uint64_t index)
{
	if (!bce || !bcache)
		return -pte_internal;

	if (bcache->nentries <= index)
		return -pte_internal;

#if !defined(__STDC_NO_ATOMICS__)
	*bce = atomic_load(&bcache->entry[(uint32_t) index]);
#else
	*bce = bcache->entry[(uint32_t) index];
#endif
	return 0;
}